

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O3

_Bool lzma_lzma_lclppb_decode(lzma_options_lzma *options,uint8_t byte)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  _Bool _Var5;
  
  _Var5 = true;
  if (byte < 0xe1) {
    cVar1 = (char)((uint)byte * 0x6d >> 8);
    bVar3 = (byte)(((byte)(byte - cVar1) >> 1) + cVar1) >> 5;
    options->pb = (uint)bVar3;
    uVar2 = (uint)(byte)(bVar3 * -0x2d + byte);
    uVar4 = uVar2 / 9;
    options->lp = uVar4;
    uVar2 = uVar2 % 9;
    options->lc = uVar2;
    _Var5 = 4 < uVar2 + uVar4;
  }
  return _Var5;
}

Assistant:

extern bool
lzma_lzma_lclppb_decode(lzma_options_lzma *options, uint8_t byte)
{
	if (byte > (4 * 5 + 4) * 9 + 8)
		return true;

	// See the file format specification to understand this.
	options->pb = byte / (9 * 5);
	byte -= options->pb * 9 * 5;
	options->lp = byte / 9;
	options->lc = byte - options->lp * 9;

	return options->lc + options->lp > LZMA_LCLP_MAX;
}